

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O3

string * bitset_to_byte_array_abi_cxx11_
                   (string *__return_storage_ptr__,
                   dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *message)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  size_t j;
  size_type pos;
  long lVar4;
  format f_1;
  format f;
  uint local_21c;
  _Alloc_hider local_218;
  code *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  undefined1 local_1f0 [32];
  uint local_1d0;
  _Bit_type *local_1c8;
  uint local_1c0;
  _Bit_pointer local_1b8;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  bool local_120;
  locale local_118 [8];
  undefined1 local_110 [224];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pos = 0;
  bVar2 = 0;
  do {
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(message,pos);
    bVar2 = bVar2 * '\x02' | bVar1;
    pos = pos + 1;
  } while (pos != 8);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,"0x%02x"
            );
  local_1f0._0_8_ = &local_218;
  local_218._M_p._0_4_ = (uint)bVar2;
  local_1f0._8_8_ = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
  local_1f0._16_8_ = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
  local_1f8 = &__return_storage_ptr__->field_2;
  boost::io::detail::
  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
             (put_holder<char,_std::char_traits<char>_> *)local_1f0);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            ((string_type *)local_1f0,local_110);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1f0._0_8_);
  if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
    operator_delete((void *)local_1f0._0_8_,(ulong)(local_1f0._16_8_ + 1));
  }
  if (8 < message->m_num_bits) {
    uVar3 = 8;
    do {
      lVar4 = 0;
      bVar2 = 0;
      do {
        bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (message,uVar3 + lVar4);
        bVar2 = bVar2 * '\x02' | bVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 ", 0x%02x");
      local_21c = (uint)bVar2;
      local_218._M_p = (pointer)&local_21c;
      local_210 = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
      local_208._M_allocated_capacity =
           (size_type)boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
      boost::io::detail::
      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (put_holder<char,_std::char_traits<char>_> *)&local_218);
      boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                ((string_type *)&local_218,
                 (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_218._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_p != &local_208) {
        operator_delete(local_218._M_p,(ulong)(local_208._M_allocated_capacity + 1));
      }
      if (local_120 == true) {
        std::locale::~locale(local_118);
        local_120 = false;
      }
      boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_altstringbuf(&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_p != &local_190) {
        operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
      }
      if ((void *)local_1f0._24_8_ != (void *)0x0) {
        operator_delete((void *)local_1f0._24_8_,(long)local_1b8 - local_1f0._24_8_);
        local_1f0._24_8_ = (void *)0x0;
        local_1d0 = 0;
        local_1c8 = (_Bit_type *)0x0;
        local_1c0 = 0;
        local_1b8 = (_Bit_pointer)0x0;
      }
      std::
      vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f0);
      uVar3 = uVar3 + 8;
    } while (uVar3 < message->m_num_bits);
  }
  if (local_110[0xd0] == true) {
    std::locale::~locale((locale *)(local_110 + 0xd8));
    local_110[0xd0] = false;
  }
  boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
  ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_110 + 0x78));
  if ((undefined1 *)local_110._80_8_ != local_110 + 0x60) {
    operator_delete((void *)local_110._80_8_,local_110._96_8_ + 1);
  }
  if ((_Bit_type *)local_110._24_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_110._24_8_,local_110._56_8_ - local_110._24_8_);
    local_110._24_8_ = (_Bit_type *)0x0;
    local_110._32_4_ = 0;
    local_110._40_8_ = (_Bit_type *)0x0;
    local_110._48_4_ = 0;
    local_110._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string bitset_to_byte_array(boost::dynamic_bitset<> const & message) {

  std::string ret;

  uint8_t byte = 0;
  
  // for the first byte
  for(size_t j = 0; j < 8; j++) {
    byte <<= 1;
    byte |= (message[j] == true ? 1 : 0); 
  }

  boost::format f("0x%02x");
  f % static_cast<int>(byte);
  ret.append(f.str());

  // for all subsequent bytes
  for(size_t i = 8; i < message.size(); i+=8) {

    byte = 0;

    for(size_t j = 0; j < 8; j++) {
      byte <<= 1;
      byte |= (message[i + j] == true ? 1 : 0);
    }

    boost::format f(", 0x%02x");
    f % static_cast<int>(byte);
    ret.append(f.str());

  }

  return ret;
}